

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetProperty(cmGeneratorTarget *this,string *prop)

{
  bool bVar1;
  TargetType tgtType;
  cmMessenger *pcVar2;
  char *pcVar3;
  
  tgtType = GetType(this);
  pcVar2 = cmMakefile::GetMessenger(this->Makefile);
  GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffc8);
  bVar1 = cmTargetPropertyComputer::PassesWhitelist
                    (tgtType,prop,pcVar2,(cmListFileBacktrace *)&stack0xffffffffffffffc8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  if (bVar1) {
    pcVar2 = cmMakefile::GetMessenger(this->Makefile);
    GetBacktrace((cmGeneratorTarget *)&stack0xffffffffffffffc8);
    pcVar3 = cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>
                       (this,prop,pcVar2,(cmListFileBacktrace *)&stack0xffffffffffffffc8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (!bVar1) {
      pcVar3 = cmTarget::GetProperty(this->Target,prop);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmGeneratorTarget::GetProperty(const std::string& prop) const
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->GetBacktrace())) {
    return nullptr;
  }
  if (const char* result = cmTargetPropertyComputer::GetProperty(
        this, prop, this->Makefile->GetMessenger(), this->GetBacktrace())) {
    return result;
  }
  if (cmSystemTools::GetFatalErrorOccured()) {
    return nullptr;
  }
  return this->Target->GetProperty(prop);
}